

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_signed_data.cc
# Opt level: O2

bool __thiscall
bssl::VerifySignedData
          (bssl *this,SignatureAlgorithm algorithm,Input signed_data,BitString *signature_value,
          EVP_PKEY *public_key,SignatureVerifyCache *cache)

{
  uint8_t *data;
  uint64_t length;
  EVP_PKEY *pEVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint8_t *data_00;
  size_t length_00;
  undefined8 *puVar5;
  uint64_t length_01;
  undefined4 in_register_00000034;
  OpenSSLErrStackTracer *this_00;
  bool bVar6;
  uint8_t *local_170;
  EVP_MD *local_160;
  undefined4 local_154;
  uint8_t *local_150;
  uchar *local_148;
  EVP_PKEY *local_140;
  string cache_key;
  EVP_PKEY_CTX *pctx;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8 [16];
  ScopedEVP_MD_CTX ctx;
  uint8_t digest [32];
  undefined1 local_38 [8];
  
  local_150 = (uint8_t *)CONCAT44(in_register_00000034,algorithm);
  puVar5 = (undefined8 *)signed_data.data_.size_;
  local_148 = signed_data.data_.data_;
  iVar4 = 6;
  length_01 = 0xc;
  local_140 = public_key;
  switch((ulong)this & 0xffffffff) {
  case 0:
    local_170 = "SignatureAlgorithm::kRsaPkcs1Sha1";
    goto LAB_0038dab8;
  case 1:
    local_170 = "RsaPkcs1Sha256";
    local_160 = EVP_sha256();
    goto LAB_0038db60;
  case 2:
    local_170 = "RsaPkcs1Sha384";
    local_160 = EVP_sha384();
    goto LAB_0038db60;
  case 3:
    local_170 = "RsaPkcs1Sha512";
    local_160 = EVP_sha512();
LAB_0038db60:
    bVar6 = false;
    length_01 = 0xe;
    break;
  case 4:
    iVar4 = 0x198;
    length_01 = 9;
    local_170 = "SignatureAlgorithm::kEcdsaSha1";
LAB_0038dab8:
    local_170 = (uint8_t *)((char *)local_170 + 0x15);
    bVar6 = false;
    local_160 = EVP_sha1();
    break;
  case 5:
    local_170 = "EcdsaSha256";
    local_160 = EVP_sha256();
    goto LAB_0038dbad;
  case 6:
    local_170 = "EcdsaSha384";
    local_160 = EVP_sha384();
    goto LAB_0038dbad;
  case 7:
    local_170 = "EcdsaSha512";
    local_160 = EVP_sha512();
LAB_0038dbad:
    bVar6 = false;
    iVar4 = 0x198;
    length_01 = 0xb;
    break;
  case 8:
    bVar6 = true;
    local_170 = "RsaPssSha256";
    local_160 = EVP_sha256();
    break;
  case 9:
    bVar6 = true;
    local_170 = "RsaPssSha384";
    local_160 = EVP_sha384();
    break;
  case 10:
    bVar6 = true;
    local_170 = "RsaPssSha512";
    local_160 = EVP_sha512();
    break;
  default:
    iVar4 = 1;
    local_170 = (uint8_t *)0x0;
    bVar6 = false;
    local_160 = (EVP_MD *)0x0;
    length_01 = 0;
  }
  iVar3 = EVP_PKEY_id((EVP_PKEY *)signature_value);
  pEVar1 = local_140;
  if (iVar4 != iVar3) {
    return false;
  }
  if (*(char *)(puVar5 + 2) != '\0') {
    return false;
  }
  data = (uint8_t *)*puVar5;
  length = puVar5[1];
  cache_key._M_dataplus._M_p = (pointer)&cache_key.field_2;
  cache_key._M_string_length = 0;
  cache_key.field_2._M_local_buf[0] = '\0';
  if (local_140 != (EVP_PKEY *)0x0) {
    CBB_zero((CBB *)&pctx);
    local_154 = 1;
    iVar4 = CBB_init((CBB *)&pctx,0x80);
    if ((((iVar4 == 0) ||
         (iVar4 = EVP_marshal_public_key((CBB *)&pctx,(EVP_PKEY *)signature_value), iVar4 == 0)) ||
        (iVar4 = SHA256_Init((SHA256_CTX *)&ctx), iVar4 == 0)) ||
       ((iVar4 = SHA256_Update((SHA256_CTX *)&ctx,&local_154,4), iVar4 == 0 ||
        (bVar2 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                           ((SHA256_CTX *)&ctx,local_170,length_01), !bVar2)))) {
LAB_0038dd6c:
      local_e8 = local_d8;
      local_e0 = 0;
      local_d8[0] = 0;
    }
    else {
      data_00 = CBB_data((CBB *)&pctx);
      length_00 = CBB_len((CBB *)&pctx);
      bVar2 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                        ((SHA256_CTX *)&ctx,data_00,length_00);
      if (((!bVar2) ||
          ((bVar2 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                              ((SHA256_CTX *)&ctx,data,length), !bVar2 ||
           (bVar2 = anon_unknown_0::SHA256UpdateWithLengthPrefixedData
                              ((SHA256_CTX *)&ctx,local_150,(uint64_t)local_148), !bVar2)))) ||
         (iVar4 = SHA256_Final(digest,(SHA256_CTX *)&ctx), iVar4 == 0)) goto LAB_0038dd6c;
      local_e8 = local_d8;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,digest,local_38);
    }
    internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
              ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&pctx);
    ::std::__cxx11::string::operator=((string *)&cache_key,(string *)&local_e8);
    ::std::__cxx11::string::~string((string *)&local_e8);
    if (cache_key._M_string_length != 0) {
      iVar4 = (**(code **)(*(long *)pEVar1 + 0x18))(pEVar1,&cache_key);
      if (iVar4 == 0) {
        bVar6 = true;
        goto LAB_0038de93;
      }
      if (iVar4 == 1) {
        bVar6 = false;
        goto LAB_0038de93;
      }
    }
  }
  EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
  pctx = (EVP_PKEY_CTX *)0x0;
  iVar4 = EVP_DigestVerifyInit
                    ((EVP_MD_CTX *)&ctx,(EVP_PKEY_CTX **)&pctx,local_160,(ENGINE *)0x0,
                     (EVP_PKEY *)signature_value);
  if ((iVar4 == 0) ||
     ((bVar6 && ((iVar4 = EVP_PKEY_CTX_set_rsa_padding(pctx,6), iVar4 == 0 ||
                 (iVar4 = EVP_PKEY_CTX_set_rsa_pss_saltlen(pctx,-1), iVar4 == 0)))))) {
    bVar6 = false;
  }
  else {
    iVar4 = EVP_DigestVerify(&ctx.ctx_,data,length,local_150,(size_t)local_148);
    bVar6 = iVar4 == 1;
    if (cache_key._M_string_length != 0) {
      (**(code **)(*(long *)pEVar1 + 0x10))(pEVar1,&cache_key,iVar4 != 1);
    }
  }
  this_00 = (OpenSSLErrStackTracer *)&ctx;
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)this_00);
  anon_unknown_0::OpenSSLErrStackTracer::~OpenSSLErrStackTracer(this_00);
LAB_0038de93:
  ::std::__cxx11::string::~string((string *)&cache_key);
  return bVar6;
}

Assistant:

bool VerifySignedData(SignatureAlgorithm algorithm, der::Input signed_data,
                      const der::BitString &signature_value,
                      EVP_PKEY *public_key, SignatureVerifyCache *cache) {
  int expected_pkey_id = 1;
  const EVP_MD *digest = nullptr;
  bool is_rsa_pss = false;
  std::string_view cache_algorithm_name;
  switch (algorithm) {
    case SignatureAlgorithm::kRsaPkcs1Sha1:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha1();
      cache_algorithm_name = "RsaPkcs1Sha1";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha256:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha256();
      cache_algorithm_name = "RsaPkcs1Sha256";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha384:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha384();
      cache_algorithm_name = "RsaPkcs1Sha384";
      break;
    case SignatureAlgorithm::kRsaPkcs1Sha512:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha512();
      cache_algorithm_name = "RsaPkcs1Sha512";
      break;

    case SignatureAlgorithm::kEcdsaSha1:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha1();
      cache_algorithm_name = "EcdsaSha1";
      break;
    case SignatureAlgorithm::kEcdsaSha256:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha256();
      cache_algorithm_name = "EcdsaSha256";
      break;
    case SignatureAlgorithm::kEcdsaSha384:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha384();
      cache_algorithm_name = "EcdsaSha384";
      break;
    case SignatureAlgorithm::kEcdsaSha512:
      expected_pkey_id = EVP_PKEY_EC;
      digest = EVP_sha512();
      cache_algorithm_name = "EcdsaSha512";
      break;

    case SignatureAlgorithm::kRsaPssSha256:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha256();
      cache_algorithm_name = "RsaPssSha256";
      is_rsa_pss = true;
      break;
    case SignatureAlgorithm::kRsaPssSha384:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha384();
      cache_algorithm_name = "RsaPssSha384";
      is_rsa_pss = true;
      break;
    case SignatureAlgorithm::kRsaPssSha512:
      expected_pkey_id = EVP_PKEY_RSA;
      digest = EVP_sha512();
      cache_algorithm_name = "RsaPssSha512";
      is_rsa_pss = true;
      break;
  }

  if (expected_pkey_id != EVP_PKEY_id(public_key)) {
    return false;
  }

  // For the supported algorithms the signature value must be a whole
  // number of bytes.
  if (signature_value.unused_bits() != 0) {
    return false;
  }
  der::Input signature_value_bytes = signature_value.bytes();

  std::string cache_key;
  if (cache) {
    cache_key = SignatureVerifyCacheKey(cache_algorithm_name, signed_data,
                                        signature_value_bytes, public_key);
    if (!cache_key.empty()) {
      switch (cache->Check(cache_key)) {
        case SignatureVerifyCache::Value::kValid:
          return true;
        case SignatureVerifyCache::Value::kInvalid:
          return false;
        case SignatureVerifyCache::Value::kUnknown:
          break;
      }
    }
  }

  OpenSSLErrStackTracer err_tracer;

  bssl::ScopedEVP_MD_CTX ctx;
  EVP_PKEY_CTX *pctx = nullptr;  // Owned by |ctx|.

  if (!EVP_DigestVerifyInit(ctx.get(), &pctx, digest, nullptr, public_key)) {
    return false;
  }

  if (is_rsa_pss) {
    // All supported RSASSA-PSS algorithms match signing and MGF-1 digest. They
    // also use the digest length as the salt length, which is specified with -1
    // in OpenSSL's API.
    if (!EVP_PKEY_CTX_set_rsa_padding(pctx, RSA_PKCS1_PSS_PADDING) ||
        !EVP_PKEY_CTX_set_rsa_pss_saltlen(pctx, -1)) {
      return false;
    }
  }

  bool ret = 1 == EVP_DigestVerify(ctx.get(), signature_value_bytes.data(),
                                   signature_value_bytes.size(),
                                   signed_data.data(), signed_data.size());
  if (!cache_key.empty()) {
    cache->Store(cache_key, ret ? SignatureVerifyCache::Value::kValid
                                : SignatureVerifyCache::Value::kInvalid);
  }

  return ret;
}